

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.h
# Opt level: O2

string * __thiscall
PlayerStrategy::getStrategyName_abi_cxx11_(string *__return_storage_ptr__,PlayerStrategy *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->strategyName);
  return __return_storage_ptr__;
}

Assistant:

std::string getStrategyName() const { return *strategyName; }